

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

void __thiscall QAbstractScrollArea::QAbstractScrollArea(QAbstractScrollArea *this,QWidget *parent)

{
  QFramePrivate *this_00;
  
  this_00 = (QFramePrivate *)operator_new(0x2f8);
  QFramePrivate::QFramePrivate(this_00);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QAbstractScrollAreaPrivate_007f8790;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x1a = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x22 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x2c = 0xffffffffffffffff;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x34 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x3c = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x50 = 0xffffffffffffffff;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x58 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x60 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x68 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x70 = 0;
  this_00[1].super_QWidgetPrivate.extra._M_t.
  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = (QWExtra *)0x0;
  QFrame::QFrame((QFrame *)this,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)this = &PTR_metaObject_007f8860;
  *(undefined ***)(this + 0x10) = &PTR__QAbstractScrollArea_007f8a38;
  QAbstractScrollAreaPrivate::init
            (*(QAbstractScrollAreaPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QAbstractScrollArea::QAbstractScrollArea(QWidget *parent)
    :QFrame(*new QAbstractScrollAreaPrivate, parent)
{
    Q_D(QAbstractScrollArea);
    QT_TRY {
        d->init();
    }